

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdi::ControllerWidget::mouseReleaseEvent(ControllerWidget *this,QMouseEvent *event)

{
  SubControl SVar1;
  undefined4 uVar2;
  uint uVar3;
  SubControl SVar4;
  QStyle *pQVar5;
  int iVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar8 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar9 [16];
  ulong local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(event + 0x40) != 1) {
    event[0xc] = (QMouseEvent)0x0;
    goto LAB_00451ca3;
  }
  uVar2 = QEventPoint::position();
  auVar9._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM1_Qa;
  auVar9._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM0_Qa;
  auVar9 = minpd(_DAT_0066f5d0,auVar9);
  auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar9._8_8_);
  auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar9._0_8_);
  uVar3 = movmskpd(uVar2,auVar8);
  uVar7 = 0x8000000000000000;
  if ((uVar3 & 1) != 0) {
    uVar7 = (ulong)(uint)(int)auVar9._0_8_ << 0x20;
  }
  local_80 = 0x80000000;
  if ((uVar3 & 2) != 0) {
    local_80 = (ulong)(uint)(int)auVar9._8_8_;
  }
  local_80 = local_80 | uVar7;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionComplex::QStyleOptionComplex((QStyleOptionComplex *)&local_78,1,0xf0000);
  QStyleOption::initFrom((QStyleOption *)&local_78,&this->super_QWidget);
  local_38 = (undefined1 *)
             (ulong)(this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                    super_QFlagsStorage<QStyle::SubControl>.i;
  pQVar5 = QWidget::style(&this->super_QWidget);
  SVar4 = (**(code **)(*(long *)pQVar5 + 0xd0))
                    (pQVar5,8,(QStyleOptionComplex *)&local_78,&local_80,this);
  QStyleOption::~QStyleOption((QStyleOption *)&local_78);
  SVar1 = this->activeControl;
  if (SVar4 == SVar1) {
    if (SVar1 == SC_ComboBoxFrame) {
      iVar6 = 0;
    }
    else if (SVar1 == SC_ComboBoxArrow) {
      iVar6 = 2;
    }
    else {
      if (SVar1 != SC_ComboBoxEditField) goto LAB_00451c94;
      iVar6 = 1;
    }
    QMetaObject::activate((QObject *)this,&staticMetaObject,iVar6,(void **)0x0);
  }
LAB_00451c94:
  this->activeControl = SC_None;
  QWidget::update(&this->super_QWidget);
LAB_00451ca3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControllerWidget::mouseReleaseEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }

    QStyle::SubControl under_mouse = getSubControl(event->position().toPoint());
    if (under_mouse == activeControl) {
        switch (activeControl) {
        case QStyle::SC_MdiCloseButton:
            emit _q_close();
            break;
        case QStyle::SC_MdiNormalButton:
            emit _q_restore();
            break;
        case QStyle::SC_MdiMinButton:
            emit _q_minimize();
            break;
        default:
            break;
        }
    }

    activeControl = QStyle::SC_None;
    update();
}